

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryOpenSubdir
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  Mutex *this_00;
  uint uVar1;
  _func_int **pp_Var2;
  ArrayDisposer **ppAVar3;
  Directory *pDVar4;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> ctx;
  size_t sVar5;
  undefined4 in_register_0000000c;
  long lVar6;
  Exception *pEVar7;
  Directory *extraout_RDX;
  _func_int **pp_Var8;
  Directory *extraout_RDX_00;
  Directory *pDVar9;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  WriteMode in_R8D;
  String *ptrCopy;
  Maybe<kj::Own<const_kj::Directory>_> MVar10;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  Fault f_1;
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  lVar6 = CONCAT44(in_register_0000000c,mode);
  pDVar9 = (Directory *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (lVar6 == 1) {
    this_00 = (Mutex *)(name_00.content.ptr + 1);
    kj::_::Mutex::lock(this_00,EXCLUSIVE);
    pp_Var2 = pDVar9[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var8 = (_func_int **)0x4f5114;
    }
    else {
      pp_Var8 = (pDVar9->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name.content.size_ = (long)pp_Var2 + (ulong)(pp_Var2 == (_func_int **)0x0);
    name.content.ptr = (char *)pp_Var8;
    ctx = Impl::openEntry((Impl *)(name_00.content.ptr + 2),name,in_R8D);
    if (ctx.ptr == (EntryImpl *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      uVar1 = ((ctx.ptr)->node).tag;
      if (uVar1 == 0) {
        if ((in_R8D & CREATE) == 0) {
          local_58._0_8_ = (Waiter *)0x0;
          local_78._0_8_ = (Exception *)0x0;
          local_78._8_8_ = (_func_int **)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_58,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_58);
        }
        sVar5 = (*(code *)**(undefined8 **)((Impl *)(name_00.content.ptr + 2))->clock)();
        name_00.content.ptr[4].content.size_ = sVar5;
        newInMemoryDirectory((kj *)(local_58 + 0x10),(Clock *)name_00.content.ptr[2].content.ptr);
        local_58._0_8_ = local_58._16_8_;
        local_58._8_8_ = local_58._24_8_;
        local_58._24_8_ = (Maybe<kj::_::Mutex::Waiter_&> *)0x0;
        EntryImpl::init((EntryImpl *)local_78,(EVP_PKEY_CTX *)ctx.ptr);
        *(undefined4 *)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             local_78._0_4_;
        *(undefined4 *)
         ((long)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode + 4) =
             local_78._4_4_;
        *(undefined4 *)&(this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
             local_78._8_4_;
        *(undefined4 *)((long)&(this->super_AtomicRefcounted).super_Disposer._vptr_Disposer + 4) =
             local_78._12_4_;
        if ((Maybe<kj::_::Mutex::Waiter_&> *)local_58._8_8_ != (Maybe<kj::_::Mutex::Waiter_&> *)0x0)
        {
          local_58._8_8_ = (Maybe<kj::_::Mutex::Waiter_&> *)0x0;
          (*(code *)**(undefined8 **)local_58._0_8_)();
        }
      }
      else {
        if (uVar1 == 3) {
          SymlinkNode::parse((Path *)local_78,(SymlinkNode *)&((ctx.ptr)->node).field_1);
          kj::_::Mutex::unlock(this_00,EXCLUSIVE);
          path_00.parts.size_ = local_78._0_8_;
          path_00.parts.ptr = name_00.content.ptr;
          MVar10 = tryOpenSubdir(this,path_00,(WriteMode)local_78._8_8_);
          pDVar9 = MVar10.ptr.ptr;
          if ((Exception *)local_78._0_8_ != (Exception *)0x0) {
            (***(_func_int ***)local_78._16_8_)
                      (local_78._16_8_,local_78._0_8_,0x18,local_78._8_8_,local_78._8_8_,
                       ArrayDisposer::Dispose_<kj::String,_false>::destruct);
            pDVar9 = extraout_RDX_01;
          }
          goto LAB_00498efb;
        }
        if (uVar1 == 2) {
          (**(code **)(**(long **)((long)&((ctx.ptr)->node).field_1 + 8) + 0x28))(local_78);
          pEVar7 = (Exception *)local_78._8_8_;
          if ((Exception *)local_78._8_8_ != (Exception *)0x0) {
            pEVar7 = (Exception *)local_78._0_8_;
          }
          (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
               (_func_int **)pEVar7;
          (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
               (_func_int **)local_78._8_8_;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
                    ((Fault *)local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x676,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x55e70e);
          (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
               (_func_int **)0x0;
          (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
          kj::_::Debug::Fault::~Fault((Fault *)local_78);
        }
      }
    }
    kj::_::Mutex::unlock(this_00,EXCLUSIVE);
    pDVar9 = extraout_RDX_02;
    goto LAB_00498efb;
  }
  if (lVar6 == 0) {
    if ((in_R8D & MODIFY) != 0) {
      LOCK();
      ppAVar3 = &((name_00.content.ptr)->content).disposer;
      *(int *)ppAVar3 = *(int *)ppAVar3 + 1;
      UNLOCK();
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)&((name_00.content.ptr)->content).size_;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer =
           (_func_int **)name_00.content.ptr;
      goto LAB_00498efb;
    }
    pDVar4 = pDVar9;
    if ((in_R8D & CREATE) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x495,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      kj::_::Debug::Fault::~Fault((Fault *)local_78);
      pDVar9 = extraout_RDX;
      goto LAB_00498efb;
    }
  }
  else {
    pp_Var2 = pDVar9[1].super_ReadableDirectory.super_FsNode._vptr_FsNode;
    if (pp_Var2 == (_func_int **)0x0) {
      pp_Var8 = (_func_int **)0x4f5114;
    }
    else {
      pp_Var8 = (pDVar9->super_ReadableDirectory).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var8;
    MVar10 = tryGetParent((InMemoryDirectory *)local_78,name_00,
                          (int)pp_Var2 + (uint)(pp_Var2 == (_func_int **)0x0));
    pDVar4 = MVar10.ptr.ptr;
    if ((Exception *)local_78._8_8_ != (Exception *)0x0) {
      (**(code **)(*(_func_int **)local_78._8_8_ + 0x88))
                (this,local_78._8_8_,pDVar9 + 3,lVar6 + -1,in_R8D);
      (**(code **)(((String *)local_78._0_8_)->content).ptr)
                (local_78._0_8_,local_78._8_8_ + *(long *)(*(_func_int **)local_78._8_8_ + -0x10));
      pDVar9 = extraout_RDX_00;
      goto LAB_00498efb;
    }
  }
  pDVar9 = pDVar4;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
LAB_00498efb:
  MVar10.ptr.ptr = pDVar9;
  MVar10.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar10.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        return atomicAddRef(*this);
      } else if (has(mode, WriteMode::CREATE)) {
        return nullptr;  // already exists
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return nullptr; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        return asDirectory(lock, *entry, mode);
      } else {
        return nullptr;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->tryOpenSubdir(path.slice(1, path.size()), mode);
      } else {
        return nullptr;
      }
    }
  }